

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetMetricProgrammableGetParamValueInfoExp
          (zet_metric_programmable_exp_handle_t hMetricProgrammable,uint32_t parameterOrdinal,
          uint32_t *pValueInfoCount,zet_metric_programmable_param_value_info_exp_t *pValueInfo)

{
  zet_pfnMetricProgrammableGetParamValueInfoExp_t pfnGetParamValueInfoExp;
  ze_result_t result;
  zet_metric_programmable_param_value_info_exp_t *pValueInfo_local;
  uint32_t *pValueInfoCount_local;
  uint32_t parameterOrdinal_local;
  zet_metric_programmable_exp_handle_t hMetricProgrammable_local;
  
  pfnGetParamValueInfoExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c7a8 != (code *)0x0) {
    pfnGetParamValueInfoExp._4_4_ =
         (*DAT_0011c7a8)(hMetricProgrammable,parameterOrdinal,pValueInfoCount,pValueInfo);
  }
  return pfnGetParamValueInfoExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricProgrammableGetParamValueInfoExp(
        zet_metric_programmable_exp_handle_t hMetricProgrammable,   ///< [in] handle of the metric programmable
        uint32_t parameterOrdinal,                      ///< [in] ordinal of the parameter in the metric programmable
        uint32_t* pValueInfoCount,                      ///< [in,out] count of parameter value information to retrieve.
                                                        ///< if value at pValueInfoCount is greater than count of value info
                                                        ///< available, then pValueInfoCount will be updated with count of value
                                                        ///< info available.
                                                        ///< The count of parameter value info available can be queried using ::zetMetricProgrammableGetParamInfoExp.
        zet_metric_programmable_param_value_info_exp_t* pValueInfo  ///< [in,out][range(1, *pValueInfoCount)] array of parameter value info.
                                                        ///< if pValueInfoCount is less than the number of value info available,
                                                        ///< then driver shall only retrieve that number of value info.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetParamValueInfoExp = context.zetDdiTable.MetricProgrammableExp.pfnGetParamValueInfoExp;
        if( nullptr != pfnGetParamValueInfoExp )
        {
            result = pfnGetParamValueInfoExp( hMetricProgrammable, parameterOrdinal, pValueInfoCount, pValueInfo );
        }
        else
        {
            // generic implementation
        }

        return result;
    }